

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

Saig_Tsim_t * Saig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Saig_Tsim_t *pSVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_MmFixed_t *pAVar6;
  uint **ppuVar7;
  uint uVar8;
  int iVar9;
  
  pSVar3 = (Saig_Tsim_t *)calloc(1,0x48);
  pSVar3->pAig = pAig;
  iVar9 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pSVar3->nWords = iVar9;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pSVar3->vStates = pVVar4;
  pAVar6 = Aig_MmFixedStart(iVar9 * 4 + 8,10000);
  pSVar3->pMem = pAVar6;
  uVar8 = 4999;
  while( true ) {
    do {
      uVar1 = uVar8 + 1;
      uVar2 = uVar8 & 1;
      uVar8 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar9 = 5;
    while (uVar1 % (iVar9 - 2U) != 0) {
      uVar2 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar1 < uVar2) goto LAB_006eea0f;
    }
  }
LAB_006eea0f:
  pSVar3->nBins = uVar1;
  ppuVar7 = (uint **)calloc(1,(long)(int)uVar1 << 3);
  pSVar3->pBins = ppuVar7;
  return pSVar3;
}

Assistant:

Saig_Tsim_t * Saig_TsiStart( Aig_Man_t * pAig )
{
    Saig_Tsim_t * p;
    p = (Saig_Tsim_t *)ABC_ALLOC( char, sizeof(Saig_Tsim_t) );
    memset( p, 0, sizeof(Saig_Tsim_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSIM_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}